

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QRect __thiscall
QStyleSheetStyle::positionRect
          (QStyleSheetStyle *this,QWidget *w,QRenderRule *rule2,int pe,QRect *originRect,
          LayoutDirection dir)

{
  QStyleSheetPositionData *pQVar1;
  QStyleSheetGeometryData *pQVar2;
  int *piVar3;
  Representation RVar4;
  Representation RVar5;
  Representation RVar6;
  Representation RVar7;
  bool bVar8;
  PositionMode PVar9;
  QSize QVar10;
  int *piVar11;
  int iVar12;
  QSize QVar13;
  QFlagsStorage<Qt::AlignmentFlag> alignment;
  int iVar14;
  QSize QVar15;
  int iVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  long in_FS_OFFSET;
  QRect QVar19;
  QRect local_58;
  QSize local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (rule2->p).d.ptr;
  if ((pQVar1 == (QStyleSheetPositionData *)0x0) ||
     (PVar9 = pQVar1->mode, PVar9 == PositionMode_Unknown)) {
    if ((0x36 < (uint)pe) ||
       (PVar9 = PositionMode_Absolute, (0x4600000fe00000U >> ((ulong)(uint)pe & 0x3f) & 1) == 0)) {
      PVar9 = PositionMode_Static;
    }
    if (pQVar1 != (QStyleSheetPositionData *)0x0) goto LAB_00352b7b;
  }
  else {
LAB_00352b7b:
    alignment.i = (pQVar1->position).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                  super_QFlagsStorage<Qt::AlignmentFlag>.i;
    if (alignment.i != 0) goto switchD_00352b9e_caseD_5;
  }
  alignment.i = 0x81;
  switch(pe) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 9:
  case 0xc:
  case 0xe:
  case 0x12:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x31:
    alignment.i = 0x84;
    break;
  case 5:
  case 6:
  case 0x25:
  case 0x27:
    break;
  case 7:
  case 0xd:
  case 0x13:
  case 0x18:
  case 0x1b:
    alignment.i = 0x42;
    break;
  case 8:
  case 0xb:
  case 0x11:
  case 0x19:
  case 0x1a:
  case 0x3b:
  case 0x3c:
    alignment.i = 0x22;
    break;
  default:
    alignment.i = 0;
    break;
  case 0xf:
  case 0x10:
    alignment.i = 0x21;
    break;
  case 0x28:
  case 0x2b:
  case 0x2c:
    alignment.i = 0x82;
  }
switchD_00352b9e_caseD_5:
  local_58.x1.m_i = -0x55555556;
  local_58.y1.m_i = -0x55555556;
  local_58.x2.m_i = -0x55555556;
  local_58.y2.m_i = -0x55555556;
  if (PVar9 == PositionMode_Absolute) {
    if (pQVar1 == (QStyleSheetPositionData *)0x0) {
      uVar18._0_4_ = originRect->x1;
      uVar18._4_4_ = originRect->y1;
      uVar17._0_4_ = originRect->x2;
      uVar17._4_4_ = originRect->y2;
    }
    else {
      piVar11 = &pQVar1->left;
      piVar3 = &pQVar1->right;
      if (dir == LeftToRight) {
        piVar11 = &pQVar1->right;
        piVar3 = &pQVar1->left;
      }
      uVar18 = CONCAT44((originRect->y1).m_i + pQVar1->top,(originRect->x1).m_i + *piVar3);
      uVar17 = CONCAT44((originRect->y2).m_i - pQVar1->bottom,(originRect->x2).m_i - *piVar11);
    }
    QVar19.x2.m_i = (int)uVar17;
    QVar19.y2.m_i = (int)((ulong)uVar17 >> 0x20);
    QVar19.x1.m_i = (int)uVar18;
    QVar19.y1.m_i = (int)((ulong)uVar18 >> 0x20);
    local_58.x1.m_i = (int)uVar18;
    RVar4.m_i = local_58.x1.m_i;
    local_58.y1.m_i = (int)((ulong)uVar18 >> 0x20);
    RVar5.m_i = local_58.y1.m_i;
    local_58.x2.m_i = (int)uVar17;
    RVar6.m_i = local_58.x2.m_i;
    local_58.y2.m_i = (int)((ulong)uVar17 >> 0x20);
    RVar7.m_i = local_58.y2.m_i;
    bVar8 = QRenderRule::hasContentsSize(rule2);
    if (bVar8) {
      local_40 = QRenderRule::contentsSize(rule2);
      QVar10 = QRenderRule::boxSize(rule2,&local_40,7);
      pQVar2 = (rule2->geo).d.ptr;
      if (pQVar2 == (QStyleSheetGeometryData *)0x0) {
        QVar15.wd.m_i = 0;
        QVar15.ht.m_i = 0;
      }
      else {
        QVar15.wd.m_i = pQVar2->minWidth;
        QVar15.ht.m_i = pQVar2->minHeight;
      }
      QVar13 = QVar15;
      if (QVar15.wd.m_i.m_i < QVar10.wd.m_i.m_i) {
        QVar13 = QVar10;
      }
      if (QVar15.ht.m_i.m_i < QVar10.ht.m_i.m_i) {
        QVar15 = QVar10;
      }
      local_40 = (QSize)(((ulong)QVar15 & 0xffffffff00000000) + ((ulong)QVar13 & 0xffffffff));
      if (QVar13.wd.m_i.m_i == -1) {
        local_40.wd.m_i = (RVar6.m_i - RVar4.m_i) + 1;
      }
      if (QVar15.ht.m_i.m_i == -1) {
        local_40.ht.m_i = (RVar7.m_i - RVar5.m_i) + 1;
      }
      QVar19 = QStyle::alignedRect(dir,(Alignment)alignment.i,&local_40,&local_58);
    }
  }
  else {
    local_40 = QRenderRule::contentsSize(rule2);
    QVar10 = QRenderRule::boxSize(rule2,&local_40,7);
    QVar10 = defaultSize(this,w,QVar10,originRect,pe);
    pQVar2 = (rule2->geo).d.ptr;
    if (pQVar2 == (QStyleSheetGeometryData *)0x0) {
      QVar13.wd.m_i = 0;
      QVar13.ht.m_i = 0;
    }
    else {
      QVar13.wd.m_i = pQVar2->minWidth;
      QVar13.ht.m_i = pQVar2->minHeight;
    }
    QVar15 = QVar10;
    if (QVar10.wd.m_i.m_i <= QVar13.wd.m_i.m_i) {
      QVar15 = QVar13;
    }
    if (QVar13.ht.m_i.m_i < QVar10.ht.m_i.m_i) {
      QVar13 = QVar10;
    }
    local_40 = (QSize)((ulong)QVar15 & 0xffffffff | (ulong)QVar13 & 0xffffffff00000000);
    QVar19 = QStyle::alignedRect(dir,(Alignment)alignment.i,&local_40,originRect);
    if (pQVar1 != (QStyleSheetPositionData *)0x0) {
      iVar12 = pQVar1->left;
      if (iVar12 == 0) {
        iVar12 = -pQVar1->right;
      }
      iVar14 = pQVar1->top;
      if (iVar14 == 0) {
        iVar14 = -pQVar1->bottom;
      }
      iVar16 = -iVar12;
      if (dir == LeftToRight) {
        iVar16 = iVar12;
      }
      local_58.x1.m_i = QVar19.x1.m_i.m_i + iVar16;
      local_58.y1.m_i = QVar19.y1.m_i.m_i + iVar14;
      local_58.x2.m_i = iVar16 + QVar19.x2.m_i.m_i;
      local_58.y2.m_i = QVar19.y2.m_i.m_i + iVar14;
      QVar19.y1.m_i = local_58.y1.m_i;
      QVar19.x1.m_i = local_58.x1.m_i;
      QVar19.x2.m_i = local_58.x2.m_i;
      QVar19.y2.m_i = local_58.y2.m_i;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar19;
}

Assistant:

QRect QStyleSheetStyle::positionRect(const QWidget *w, const QRenderRule &rule2, int pe,
                                     const QRect &originRect, Qt::LayoutDirection dir) const
{
    const QStyleSheetPositionData *p = rule2.position();
    PositionMode mode = (p && p->mode != PositionMode_Unknown) ? p->mode : defaultPositionMode(pe);
    Qt::Alignment position = (p && p->position != 0) ? p->position : defaultPosition(pe);
    QRect r;

    if (mode != PositionMode_Absolute) {
        QSize sz = defaultSize(w, rule2.size(), originRect, pe);
        sz = sz.expandedTo(rule2.minimumContentsSize());
        r = QStyle::alignedRect(dir, position, sz, originRect);
        if (p) {
            int left = p->left ? p->left : -p->right;
            int top = p->top ? p->top : -p->bottom;
            r.translate(dir == Qt::LeftToRight ? left : -left, top);
        }
    } else {
        r = p ? originRect.adjusted(dir == Qt::LeftToRight ? p->left : p->right, p->top,
                                   dir == Qt::LeftToRight ? -p->right : -p->left, -p->bottom)
              : originRect;
        if (rule2.hasContentsSize()) {
            QSize sz = rule2.size().expandedTo(rule2.minimumContentsSize());
            if (sz.width() == -1) sz.setWidth(r.width());
            if (sz.height() == -1) sz.setHeight(r.height());
            r = QStyle::alignedRect(dir, position, sz, r);
        }
    }
    return r;
}